

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_read_bytes(coda_cursor *cursor,uint8_t *dst,int64_t offset,int64_t length)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  int iVar4;
  coda_cursor sub_cursor;
  coda_cursor local_330;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar2[1].backend;
  if (cVar1 != 2) {
    if (cVar1 == 3) {
      memcpy(&local_330,cursor,0x310);
      iVar3 = coda_cursor_use_base_type_of_special_type(&local_330);
      iVar4 = -1;
      if (iVar3 == 0) {
        iVar4 = coda_cursor_read_bytes(&local_330,dst,offset,length);
      }
    }
    else {
      coda_set_error(-0x69,"can not read this data using a raw bytes data type");
      iVar4 = -1;
    }
    return iVar4;
  }
  if ((pcVar2->definition->format & ~coda_format_xml) == coda_format_ascii) {
    iVar4 = coda_ascii_cursor_read_bytes(cursor,dst,offset,length);
    return iVar4;
  }
  iVar4 = coda_bin_cursor_read_bytes(cursor,dst,offset,length);
  return iVar4;
}

Assistant:

int coda_mem_cursor_read_bytes(const coda_cursor *cursor, uint8_t *dst, int64_t offset, int64_t length)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_read_bytes(&sub_cursor, dst, offset, length);
    }

    if (type->tag == tag_mem_data)
    {
        if (type->definition->format == coda_format_ascii || type->definition->format == coda_format_xml)
        {
            return coda_ascii_cursor_read_bytes(cursor, dst, offset, length);
        }
        return coda_bin_cursor_read_bytes(cursor, dst, offset, length);
    }

    coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read this data using a raw bytes data type");
    return -1;
}